

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O2

bool Function_Template::form2_BinaryDilate(BinaryDilateForm2 BinaryDilate)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  size_type __n;
  uint32_t roiHeight;
  uint32_t roiWidth;
  uint32_t roiY;
  uint32_t roiX;
  Image output;
  vector<unsigned_char,_std::allocator<unsigned_char>_> fillData;
  Image input;
  
  uVar3 = rand();
  __n = 0x14;
  if (0x14 < (uint)((ulong)uVar3 % 200)) {
    __n = (ulong)uVar3 % 200;
  }
  input._vptr_ImageTemplate._0_1_ = 0xff;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&fillData,__n,(value_type_conflict1 *)&input,(allocator_type *)&output);
  input._vptr_ImageTemplate._0_1_ = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&fillData,(uchar *)&input);
  Unit_Test::randomImage(&input,&fillData);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&output,&input);
  Unit_Test::generateRoi(&output,&roiX,&roiY,&roiWidth,&roiHeight);
  bVar1 = Unit_Test::verifyImage(&output,roiX,roiY,roiWidth,roiHeight,'\0');
  bVar2 = true;
  if (bVar1) {
    uVar3 = rand();
    uVar4 = rand();
    (*BinaryDilate)(&output,roiX,roiY,roiWidth,roiHeight,uVar3 % 5 + (uint)(uVar3 % 5 == 0),
                    uVar4 % 5 + (uint)(uVar4 % 5 == 0));
    bVar2 = Unit_Test::verifyImage(&output,roiX,roiY,roiWidth,roiHeight,0xff);
  }
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&output);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&input);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&fillData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return bVar2;
}

Assistant:

bool form2_BinaryDilate(BinaryDilateForm2 BinaryDilate)
    {
        std::vector< uint8_t > fillData( randomValue<uint32_t>(20, 200), 255u );
        fillData.push_back(0u);

        const PenguinV_Image::Image input = randomImage( fillData );
        PenguinV_Image::Image output = input;

        uint32_t roiX, roiY, roiWidth, roiHeight;
        generateRoi( output, roiX, roiY, roiWidth, roiHeight );
        if ( !verifyImage(output, roiX, roiY, roiWidth, roiHeight, 0u) ) // full ROI is black, nothing to dilate
            return true;

        const uint32_t dilationX = randomValue<uint32_t>(1, 5);
        const uint32_t dilationY = randomValue<uint32_t>(1, 5);
        
        BinaryDilate( output, roiX, roiY, roiWidth, roiHeight, dilationX, dilationY );

        return verifyImage( output, roiX, roiY, roiWidth, roiHeight, 255u );
    }